

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_destroy(opj_j2k_t *p_j2k)

{
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_j2k->m_is_decoder == 0) {
      if ((p_j2k->m_specific_param).m_encoder.m_encoded_tile_data != (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_encoded_tile_data);
        (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_header_data != (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
        (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
      }
      if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data != (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
        (p_j2k->m_specific_param).m_encoder.m_header_tile_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_decoder.m_tile_ind_to_dec = 0;
      }
    }
    else {
      if ((p_j2k->m_specific_param).m_decoder.m_default_tcp != (opj_tcp_t *)0x0) {
        opj_j2k_tcp_destroy((p_j2k->m_specific_param).m_decoder.m_default_tcp);
        opj_free((p_j2k->m_specific_param).m_decoder.m_default_tcp);
        (p_j2k->m_specific_param).m_decoder.m_default_tcp = (opj_tcp_t *)0x0;
      }
      if ((p_j2k->m_specific_param).m_decoder.m_header_data != (OPJ_BYTE *)0x0) {
        opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
        (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
        (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
      }
    }
    opj_tcd_destroy(p_j2k->m_tcd);
    opj_j2k_cp_destroy(&p_j2k->m_cp);
    memset(&p_j2k->m_cp,0,0x98);
    opj_procedure_list_destroy(p_j2k->m_procedure_list);
    p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
    opj_procedure_list_destroy(p_j2k->m_validation_list);
    p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
    j2k_destroy_cstr_index(p_j2k->cstr_index);
    p_j2k->cstr_index = (opj_codestream_index_t *)0x0;
    opj_image_destroy(p_j2k->m_private_image);
    p_j2k->m_private_image = (opj_image_t *)0x0;
    opj_image_destroy(p_j2k->m_output_image);
    p_j2k->m_output_image = (opj_image_t *)0x0;
    opj_free(p_j2k);
  }
  return;
}

Assistant:

void opj_j2k_destroy (opj_j2k_t *p_j2k)
{
        if (p_j2k == 00) {
                return;
        }

        if (p_j2k->m_is_decoder) {

                if (p_j2k->m_specific_param.m_decoder.m_default_tcp != 00) {
                        opj_j2k_tcp_destroy(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        opj_free(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        p_j2k->m_specific_param.m_decoder.m_default_tcp = 00;
                }

                if (p_j2k->m_specific_param.m_decoder.m_header_data != 00) {
                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                        p_j2k->m_specific_param.m_decoder.m_header_data = 00;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                }
        }
        else {

                if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_encoded_tile_data = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer);
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer = 00;
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_header_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data = 00;
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
                }
        }

        opj_tcd_destroy(p_j2k->m_tcd);

        opj_j2k_cp_destroy(&(p_j2k->m_cp));
        memset(&(p_j2k->m_cp),0,sizeof(opj_cp_t));

        opj_procedure_list_destroy(p_j2k->m_procedure_list);
        p_j2k->m_procedure_list = 00;

        opj_procedure_list_destroy(p_j2k->m_validation_list);
        p_j2k->m_procedure_list = 00;

        j2k_destroy_cstr_index(p_j2k->cstr_index);
        p_j2k->cstr_index = NULL;

        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;

        opj_image_destroy(p_j2k->m_output_image);
        p_j2k->m_output_image = NULL;

        opj_free(p_j2k);
}